

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcomplex.c
# Opt level: O1

double z_abs(doublecomplex *z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = z->r;
  dVar3 = z->i;
  dVar1 = -dVar2;
  if (-dVar2 <= dVar2) {
    dVar1 = dVar2;
  }
  dVar2 = -dVar3;
  if (-dVar3 <= dVar3) {
    dVar2 = dVar3;
  }
  dVar3 = dVar2;
  if (dVar2 <= dVar1) {
    dVar3 = dVar1;
  }
  if ((dVar1 + dVar2 != dVar3) || (NAN(dVar1 + dVar2) || NAN(dVar3))) {
    if (dVar2 <= dVar1) {
      dVar1 = dVar2;
    }
    dVar2 = (dVar1 / dVar3) * (dVar1 / dVar3) + 1.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = dVar3 * dVar2;
  }
  return dVar3;
}

Assistant:

double z_abs(doublecomplex *z)
{
    double temp;
    double real = z->r;
    double imag = z->i;

    if (real < 0) real = -real;
    if (imag < 0) imag = -imag;
    if (imag > real) {
	temp = real;
	real = imag;
	imag = temp;
    }
    if ((real+imag) == real) return(real);
  
    temp = imag/real;
    temp = real*sqrt(1.0 + temp*temp);  /*overflow!!*/
    return (temp);
}